

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O3

size_t HTS_Tree_search_node(HTS_Tree *tree,char *string)

{
  HTS_Boolean HVar1;
  size_t sVar2;
  _HTS_Tree *p_Var3;
  
  if (tree == (HTS_Tree *)0x0) {
    HTS_error(0,"HTS_Tree_search_node: Cannot find node.\n");
    sVar2 = 1;
  }
  else {
    p_Var3 = tree[1].next;
    while (p_Var3 != (_HTS_Tree *)0x0) {
      do {
        p_Var3 = p_Var3->next;
        if (p_Var3 == (_HTS_Tree *)0x0) {
          tree = (HTS_Tree *)((HTS_Node *)tree)->no;
          goto LAB_0017cefb;
        }
        HVar1 = HTS_pattern_match(string,(char *)p_Var3->head);
      } while (HVar1 == '\0');
      tree = (HTS_Tree *)((HTS_Node *)tree)->yes;
LAB_0017cefb:
      if (((HTS_Node *)tree)->pdf != 0) {
        return ((HTS_Node *)tree)->pdf;
      }
      p_Var3 = (_HTS_Tree *)((HTS_Node *)tree)->quest;
    }
    sVar2 = ((HTS_Node *)tree)->pdf;
  }
  return sVar2;
}

Assistant:

static size_t HTS_Tree_search_node(HTS_Tree * tree, const char *string)
{
   HTS_Node *node = tree->root;

   while (node != NULL) {
      if (node->quest == NULL)
         return node->pdf;
      if (HTS_Question_match(node->quest, string)) {
         if (node->yes->pdf > 0)
            return node->yes->pdf;
         node = node->yes;
      } else {
         if (node->no->pdf > 0)
            return node->no->pdf;
         node = node->no;
      }
   }

   HTS_error(0, "HTS_Tree_search_node: Cannot find node.\n");
   return 1;
}